

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tr1::tuple<testing::Matcher<int*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<int*,unsigned_long,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<int_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
                *matcher_tuple,
               tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tr1::tuple<testing::Matcher<int*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<int*,unsigned_long,void,void,void,void,void,void,void,void>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<unsigned_long>::Matches
                      (&(matcher_tuple->f1_).super_MatcherBase<unsigned_long>,value_tuple->f1_);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }